

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  BaseIt it;
  UntypedMapIterator local_28;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_10;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  local_10 = this;
  internal::UntypedMapBase::begin(&local_28,(UntypedMapBase *)this);
  it.m_ = local_28.m_;
  it.node_ = local_28.node_;
  it.bucket_index_ = local_28.bucket_index_;
  it._20_4_ = local_28._20_4_;
  iterator::iterator(__return_storage_ptr__,it);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() ABSL_ATTRIBUTE_LIFETIME_BOUND {
    return iterator(Base::begin());
  }